

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.cpp
# Opt level: O2

vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_true> *
duckdb::EquiWidthBinsTimestamp::Operation
          (vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_true> *__return_storage_ptr__,
          Expression *expr,timestamp_t input_min,timestamp_t input_max,idx_t bin_count,
          bool nice_rounding)

{
  bool bVar1;
  interval_t step;
  idx_t iVar2;
  bool bVar3;
  timestamp_t this;
  InvalidInputException *this_00;
  long lVar4;
  long extraout_RDX;
  long extraout_RDX_00;
  long lVar5;
  long lVar6;
  long lVar7;
  timestamp_t left;
  PrimitiveType<long> *val;
  pointer pPVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  interval_t iVar13;
  interval_t right;
  int micros;
  int64_t iVar14;
  int32_t min_year;
  double local_e8;
  timestamp_t local_e0;
  int32_t local_d8;
  int32_t local_d4;
  uint local_d0;
  int32_t max_micros;
  int32_t max_sec;
  int32_t max_minute;
  int32_t min_micros;
  int32_t min_sec;
  int32_t min_minute;
  int32_t min_hour;
  int32_t min_day;
  int32_t min_month;
  double local_a8;
  long local_a0;
  long local_98;
  idx_t local_90;
  vector<duckdb::PrimitiveType<long>,_true> interpolated_values;
  int32_t max_hour;
  int32_t max_day;
  int32_t max_month;
  int32_t max_year;
  interval_t local_58;
  double local_48;
  double dStack_40;
  
  local_e0.value = input_min.value;
  bVar3 = Value::IsFinite<duckdb::timestamp_t>(input_min);
  if (bVar3) {
    bVar3 = Value::IsFinite<duckdb::timestamp_t>(input_max);
    if (bVar3) {
      if (nice_rounding) {
        GetTimestampComponents
                  (local_e0,&min_year,&min_month,&min_day,&min_hour,&min_minute,&min_sec,&min_micros
                  );
        GetTimestampComponents
                  (input_max,&max_year,&max_month,&max_day,&max_hour,&max_minute,&max_sec,
                   &max_micros);
        local_d0 = max_year;
        local_d4 = max_month;
        local_d8 = max_day;
        local_98 = (long)max_hour;
        lVar5 = local_98 - min_hour;
        local_a0 = (long)max_minute;
        lVar6 = local_a0 - min_minute;
        lVar4 = ((long)max_sec - (long)min_sec) * 1000000;
        lVar7 = ((long)max_micros - (long)min_micros) + lVar4;
        auVar9._8_4_ = (int)(bin_count >> 0x20);
        auVar9._0_8_ = bin_count;
        auVar9._12_4_ = 0x45300000;
        dVar10 = auVar9._8_8_ - 1.9342813113834067e+25;
        dVar12 = dVar10 + ((double)CONCAT44(0x43300000,(int)bin_count) - 4503599627370496.0);
        local_a8 = (double)((max_month - min_month) + (max_year - min_year) * 0xc) / dVar12;
        dVar11 = (double)(max_day - min_day) / (double)(int)bin_count;
        if (0.0 < local_a8) {
          local_e8 = dVar11;
          local_48 = dVar12;
          dStack_40 = dVar10;
          dVar11 = floor(local_a8);
          dVar11 = local_e8 + (local_a8 - dVar11) * 30.0;
          lVar4 = extraout_RDX;
          dVar12 = local_48;
        }
        dVar12 = (double)(lVar7 + lVar6 * 60000000 + lVar5 * 3600000000) / dVar12;
        local_90 = bin_count;
        if (0.0 < dVar11) {
          local_e8 = dVar11;
          dVar11 = floor(dVar11);
          dVar12 = dVar12 + (local_e8 - dVar11) * 86400000000.0;
          lVar4 = extraout_RDX_00;
          dVar11 = local_e8;
        }
        iVar13._0_8_ = (long)dVar12;
        iVar14 = 0xcd532d;
        iVar13.micros = lVar4;
        iVar13 = MakeIntervalNice((duckdb *)CONCAT44((int)dVar11,(int)local_a8),iVar13);
        lVar5 = iVar13.micros;
        micros = iVar13.months;
        step.micros = iVar14;
        step.months = (int)lVar5;
        step.days = (int)((ulong)lVar5 >> 0x20);
        lVar4 = local_98;
        local_58 = iVar13;
        this = MakeTimestampNice((duckdb *)(ulong)local_d0,local_d4,local_d8,(int32_t)local_98,
                                 (int32_t)local_a0,max_sec,max_micros,micros,step);
        iVar2 = local_90;
        bVar3 = 0 < iVar13.days;
        bVar1 = lVar5 < 1;
        iVar14 = CONCAT71((int7)((ulong)lVar4 >> 8),bVar1);
        (__return_storage_ptr__->
        super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
        ).
        super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        lVar4 = 1;
        if ((bVar3 || 0 < micros) || !bVar1) {
          lVar4 = lVar5;
        }
        (__return_storage_ptr__->
        super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
        ).
        super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->
        super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
        ).
        super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        left.value = 0;
        if ((bVar3 || 0 < micros) || !bVar1) {
          left.value = iVar13._0_8_;
        }
        while ((local_e0.value <= this.value &&
               ((ulong)((long)(__return_storage_ptr__->
                              super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
                              ).
                              super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(__return_storage_ptr__->
                              super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
                              ).
                              super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) < iVar2))) {
          interpolated_values.
          super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>.
          super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)this.value;
          ::std::
          vector<duckdb::PrimitiveType<duckdb::timestamp_t>,std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>>>
          ::emplace_back<duckdb::PrimitiveType<duckdb::timestamp_t>>
                    ((vector<duckdb::PrimitiveType<duckdb::timestamp_t>,std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>>>
                      *)__return_storage_ptr__,
                     (PrimitiveType<duckdb::timestamp_t> *)&interpolated_values);
          right.micros = iVar14;
          right.months = (int)lVar4;
          right.days = (int)((ulong)lVar4 >> 0x20);
          this = SubtractOperator::
                 Operation<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>
                           (this.value,left,right);
        }
      }
      else {
        EquiWidthBinsInteger::Operation
                  (&interpolated_values,expr,local_e0.value,input_max.value,bin_count,false);
        (__return_storage_ptr__->
        super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
        ).
        super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->
        super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
        ).
        super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->
        super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
        ).
        super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        for (pPVar8 = interpolated_values.
                      super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
                      .
                      super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pPVar8 != interpolated_values.
                      super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
                      .
                      super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; pPVar8 = pPVar8 + 1) {
          _min_year = (timestamp_t)pPVar8->val;
          ::std::
          vector<duckdb::PrimitiveType<duckdb::timestamp_t>,std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>>>
          ::emplace_back<duckdb::PrimitiveType<duckdb::timestamp_t>>
                    ((vector<duckdb::PrimitiveType<duckdb::timestamp_t>,std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>>>
                      *)__return_storage_ptr__,(PrimitiveType<duckdb::timestamp_t> *)&min_year);
        }
        ::std::
        _Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>::
        ~_Vector_base((_Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
                       *)&interpolated_values);
      }
      return __return_storage_ptr__;
    }
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&interpolated_values,
             "equi_width_bucket does not support infinite or nan as min/max value",
             (allocator *)&min_year);
  InvalidInputException::InvalidInputException<>(this_00,expr,(string *)&interpolated_values);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static vector<PrimitiveType<timestamp_t>> Operation(const Expression &expr, timestamp_t input_min,
	                                                    timestamp_t input_max, idx_t bin_count, bool nice_rounding) {
		if (!Value::IsFinite(input_min) || !Value::IsFinite(input_max)) {
			throw InvalidInputException(expr, "equi_width_bucket does not support infinite or nan as min/max value");
		}

		if (!nice_rounding) {
			// if we are not doing nice rounding it is pretty simple - just interpolate between the timestamp values
			auto interpolated_values =
			    EquiWidthBinsInteger::Operation(expr, input_min.value, input_max.value, bin_count, false);

			vector<PrimitiveType<timestamp_t>> result;
			for (auto &val : interpolated_values) {
				result.push_back(timestamp_t(val.val));
			}
			return result;
		}
		// fetch the components of the timestamps
		int32_t min_year, min_month, min_day, min_hour, min_minute, min_sec, min_micros;
		int32_t max_year, max_month, max_day, max_hour, max_minute, max_sec, max_micros;
		GetTimestampComponents(input_min, min_year, min_month, min_day, min_hour, min_minute, min_sec, min_micros);
		GetTimestampComponents(input_max, max_year, max_month, max_day, max_hour, max_minute, max_sec, max_micros);

		// get the interval differences per component
		// note: these can be negative (except for the largest non-zero difference)
		interval_t interval_diff;
		interval_diff.months = (max_year - min_year) * Interval::MONTHS_PER_YEAR + (max_month - min_month);
		interval_diff.days = max_day - min_day;
		interval_diff.micros = (max_hour - min_hour) * Interval::MICROS_PER_HOUR +
		                       (max_minute - min_minute) * Interval::MICROS_PER_MINUTE +
		                       (max_sec - min_sec) * Interval::MICROS_PER_SEC + (max_micros - min_micros);

		double step_months = static_cast<double>(interval_diff.months) / static_cast<double>(bin_count);
		double step_days = static_cast<double>(interval_diff.days) / static_cast<int32_t>(bin_count);
		double step_micros = static_cast<double>(interval_diff.micros) / static_cast<double>(bin_count);
		// since we truncate the months/days, propagate any fractional component to the unit below (i.e. 0.2 months
		// becomes 6 days)
		if (step_months > 0) {
			double overflow_months = step_months - std::floor(step_months);
			step_days += overflow_months * Interval::DAYS_PER_MONTH;
		}
		if (step_days > 0) {
			double overflow_days = step_days - std::floor(step_days);
			step_micros += overflow_days * Interval::MICROS_PER_DAY;
		}
		interval_t step;
		step.months = static_cast<int32_t>(step_months);
		step.days = static_cast<int32_t>(step_days);
		step.micros = static_cast<int64_t>(step_micros);

		// now we make the max, and the step nice
		step = MakeIntervalNice(step);
		timestamp_t timestamp_val =
		    MakeTimestampNice(max_year, max_month, max_day, max_hour, max_minute, max_sec, max_micros, step);
		if (step.months <= 0 && step.days <= 0 && step.micros <= 0) {
			// interval must be at least one microsecond
			step.months = step.days = 0;
			step.micros = 1;
		}

		vector<PrimitiveType<timestamp_t>> result;
		while (timestamp_val.value >= input_min.value && result.size() < bin_count) {
			result.push_back(timestamp_val);
			timestamp_val = SubtractOperator::Operation<timestamp_t, interval_t, timestamp_t>(timestamp_val, step);
		}
		return result;
	}